

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

void __thiscall
slang::
TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
::~TypedBumpAllocator
          (TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           *this)

{
  Segment *pSVar1;
  byte **ppbVar2;
  byte *pbVar3;
  
  for (pSVar1 = (this->super_BumpAllocator).head; pSVar1 != (Segment *)0x0; pSVar1 = pSVar1->prev) {
    if (pSVar1 + 1 != (Segment *)pSVar1->current) {
      ppbVar2 = &pSVar1[2].current;
      do {
        if (*ppbVar2 != (byte *)0x0) {
          operator_delete(*ppbVar2,(long)ppbVar2[-2] * 0x100 + 0x100);
        }
        pbVar3 = (byte *)(ppbVar2 + 3);
        ppbVar2 = ppbVar2 + 6;
      } while (pbVar3 != pSVar1->current);
    }
  }
  BumpAllocator::~BumpAllocator(&this->super_BumpAllocator);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }